

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

aiNodeAnim * __thiscall
Assimp::FBX::FBXConverter::GenerateTranslationNodeAnim
          (FBXConverter *this,string *name,Model *param_2,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time,
          bool inverse)

{
  tuple<aiNodeAnim_*,_std::default_delete<aiNodeAnim>_> na_00;
  aiVectorKey *paVar1;
  aiQuatKey *paVar2;
  LayerMap *pLVar3;
  pointer __p;
  uint i;
  ulong uVar4;
  long lVar5;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> na;
  
  pLVar3 = (LayerMap *)curves;
  na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>)operator_new(0x438);
  *(undefined4 *)
   na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
   super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl = 0;
  *(char *)((long)na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4) = '\0';
  memset((char *)((long)na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                        .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 5),0x1b,0x3ff);
  *(aiQuatKey **)
   ((long)na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) = (aiQuatKey *)0x0;
  *(uint *)((long)na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x420) = 0;
  *(undefined8 *)
   ((long)na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404) = 0;
  *(undefined8 *)
   ((long)na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x40c) = 0;
  *(aiVectorKey **)
   ((long)na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428) = (aiVectorKey *)0x0;
  *(undefined8 *)
   ((long)na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x430) = 0;
  uVar4 = name->_M_string_length;
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
       super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
  if (uVar4 < 0x400) {
    *(int *)na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl = (int)uVar4;
    memcpy((char *)((long)na_00.
                          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4),
           (name->_M_dataplus)._M_p,uVar4);
    ((char *)((long)na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                    super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4))[uVar4] = '\0';
  }
  ConvertTranslationKeys
            (this,(aiNodeAnim *)
                  na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl,curves,pLVar3,start,stop,
             max_time,min_time);
  if (inverse) {
    lVar5 = 8;
    for (uVar4 = 0;
        uVar4 < *(uint *)((long)na_00.
                                super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                                .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404);
        uVar4 = uVar4 + 1) {
      aiVector3t<float>::operator*=
                ((aiVector3t<float> *)
                 ((long)&(*(aiVectorKey **)
                           ((long)na_00.
                                  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                                  .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x408))
                         ->mTime + lVar5),-1.0);
      lVar5 = lVar5 + 0x18;
    }
  }
  paVar1 = (aiVectorKey *)operator_new__(0x18);
  *(aiVectorKey **)
   ((long)na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428) = paVar1;
  paVar1->mTime = 0.0;
  *(uint *)((long)na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x420) = 1;
  (paVar1->mValue).x = 1.0;
  (paVar1->mValue).y = 1.0;
  (paVar1->mValue).z = 1.0;
  paVar2 = (aiQuatKey *)operator_new__(0x18);
  paVar2->mTime = 0.0;
  *(aiQuatKey **)
   ((long)na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) = paVar2;
  *(uint *)((long)na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x410) = 1;
  (paVar2->mValue).w = 1.0;
  (paVar2->mValue).x = 0.0;
  (paVar2->mValue).y = 0.0;
  (paVar2->mValue).z = 0.0;
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)0x0;
  std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(&na);
  return (aiNodeAnim *)
         (tuple<aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>)
         na_00.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
         super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
}

Assistant:

aiNodeAnim* FBXConverter::GenerateTranslationNodeAnim(const std::string& name,
            const Model& /*target*/,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time,
            bool inverse) {
            std::unique_ptr<aiNodeAnim> na(new aiNodeAnim());
            na->mNodeName.Set(name);

            ConvertTranslationKeys(na.get(), curves, layer_map, start, stop, max_time, min_time);

            if (inverse) {
                for (unsigned int i = 0; i < na->mNumPositionKeys; ++i) {
                    na->mPositionKeys[i].mValue *= -1.0f;
                }
            }

            // dummy scaling key
            na->mScalingKeys = new aiVectorKey[1];
            na->mNumScalingKeys = 1;

            na->mScalingKeys[0].mTime = 0.;
            na->mScalingKeys[0].mValue = aiVector3D(1.0f, 1.0f, 1.0f);

            // dummy rotation key
            na->mRotationKeys = new aiQuatKey[1];
            na->mNumRotationKeys = 1;

            na->mRotationKeys[0].mTime = 0.;
            na->mRotationKeys[0].mValue = aiQuaternion();

            return na.release();
        }